

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O1

void av1_highbd_fwd_txfm(int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  TX_TYPE TVar1;
  _func_void_int16_t_ptr_int32_t_ptr_int_TX_TYPE_int **pp_Var2;
  int iVar3;
  _func_void_int16_t_ptr_int32_t_ptr_int_TX_TYPE_int *UNRECOVERED_JUMPTABLE;
  
  switch(txfm_param->tx_size) {
  case '\0':
    if (txfm_param->lossless == 0) {
      (*av1_fwd_txfm2d_4x4)(src_diff,coeff,diff_stride,txfm_param->tx_type,txfm_param->bd);
      return;
    }
    (*av1_fwht4x4)(src_diff,coeff,diff_stride);
    return;
  case '\x01':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x8;
    goto LAB_001d13a8;
  case '\x02':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x16;
    goto LAB_001d13a8;
  case '\x03':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x32;
    goto LAB_001d13a8;
  case '\x04':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x64;
    goto LAB_001d1380;
  case '\x05':
    pp_Var2 = &av1_fwd_txfm2d_4x8;
    break;
  case '\x06':
    pp_Var2 = &av1_fwd_txfm2d_8x4;
    break;
  case '\a':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x16;
    goto LAB_001d13a8;
  case '\b':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x8;
LAB_001d13a8:
    UNRECOVERED_JUMPTABLE = *pp_Var2;
    goto LAB_001d13ab;
  case '\t':
    pp_Var2 = &av1_fwd_txfm2d_16x32;
    break;
  case '\n':
    pp_Var2 = &av1_fwd_txfm2d_32x16;
    break;
  case '\v':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x64;
    goto LAB_001d12ed;
  case '\f':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x32;
LAB_001d12ed:
    (**pp_Var2)(src_diff,coeff,diff_stride,txfm_param->tx_type,iVar3);
    return;
  case '\r':
    pp_Var2 = &av1_fwd_txfm2d_4x16;
    break;
  case '\x0e':
    pp_Var2 = &av1_fwd_txfm2d_16x4;
    break;
  case '\x0f':
    pp_Var2 = &av1_fwd_txfm2d_8x32;
    break;
  case '\x10':
    pp_Var2 = &av1_fwd_txfm2d_32x8;
    break;
  case '\x11':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x64;
    goto LAB_001d1380;
  case '\x12':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x16;
LAB_001d1380:
    (**pp_Var2)(src_diff,coeff,diff_stride,'\0',iVar3);
    return;
  default:
    return;
  }
  UNRECOVERED_JUMPTABLE = *pp_Var2;
  TVar1 = txfm_param->tx_type;
  iVar3 = txfm_param->bd;
LAB_001d13ab:
  (*UNRECOVERED_JUMPTABLE)(src_diff,coeff,diff_stride,TVar1,iVar3);
  return;
}

Assistant:

void av1_highbd_fwd_txfm(const int16_t *src_diff, tran_low_t *coeff,
                         int diff_stride, TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_64X64:
      highbd_fwd_txfm_64x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X64:
      highbd_fwd_txfm_32x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X32:
      highbd_fwd_txfm_64x32(src_diff, coeff, diff_stride, txfm_param);
      break;

    case TX_32X32:
      highbd_fwd_txfm_32x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X16:
      highbd_fwd_txfm_16x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X8:
      highbd_fwd_txfm_8x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X8:
      highbd_fwd_txfm_4x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X4:
      highbd_fwd_txfm_8x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X16:
      highbd_fwd_txfm_8x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X8:
      highbd_fwd_txfm_16x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X32:
      highbd_fwd_txfm_16x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X16:
      highbd_fwd_txfm_32x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X4:
      highbd_fwd_txfm_4x4(src_diff, coeff, diff_stride, txfm_param);
      break;
#if !CONFIG_REALTIME_ONLY
    case TX_4X16:
      highbd_fwd_txfm_4x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X4:
      highbd_fwd_txfm_16x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X32:
      highbd_fwd_txfm_8x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X8:
      highbd_fwd_txfm_32x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X64:
      highbd_fwd_txfm_16x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X16:
      highbd_fwd_txfm_64x16(src_diff, coeff, diff_stride, txfm_param);
      break;
#endif
    default: assert(0); break;
  }
}